

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readImports(WasmBinaryReader *this)

{
  byte bVar1;
  type_conflict1 tVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t index_00;
  pointer pFVar5;
  type func;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pMVar9;
  pointer pMVar10;
  pointer pMVar11;
  pointer pMVar12;
  pointer pGVar13;
  size_type sVar14;
  type *ptVar15;
  type_conflict1 *ptVar16;
  pointer pTVar17;
  size_type sVar18;
  Name NVar19;
  string_view sVar20;
  Signature sig;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  Name name_08;
  Type in_stack_fffffffffffff758;
  allocator<char> local_651;
  string local_650;
  Signature local_630;
  HeapType local_620;
  char *local_618;
  HeapType HStack_610;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_600;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> curr_2;
  uint32_t index_1;
  type_conflict1 *isExplicit_4;
  type *name_4;
  string local_5d8;
  string_view local_5b8;
  pair<wasm::Name,_bool> local_5a8;
  Expression *local_590;
  char *local_588;
  uintptr_t uStack_580;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_578;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> curr_1;
  string local_568;
  uint32_t local_544;
  Type TStack_540;
  uint32_t mutable_;
  Type type_1;
  type_conflict1 *isExplicit_3;
  type *name_3;
  string local_520;
  string_view local_500;
  pair<wasm::Name,_bool> local_4f0;
  Address local_4d8;
  Type local_4d0;
  Address local_4c8;
  Address local_4c0;
  char *local_4b8;
  Address AStack_4b0;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_4a8;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  type_conflict1 *isExplicit_2;
  type *name_2;
  string local_488;
  string_view local_468;
  pair<wasm::Name,_bool> local_458;
  allocator<char> local_439;
  string local_438;
  Address local_418;
  bool local_409;
  Type TStack_408;
  bool is_shared;
  Type local_400;
  Address local_3f8;
  Address local_3f0;
  HeapType local_3e8;
  Address local_3e0;
  char *local_3d8;
  Type TStack_3d0;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_3c0;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> table;
  type_conflict1 *isExplicit_1;
  type *name_1;
  string local_3a0;
  string_view local_380;
  pair<wasm::Name,_bool> local_370;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_358;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_340;
  char *local_338;
  HeapType HStack_330;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_320;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> curr;
  string local_2f8;
  string local_2d8;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  HeapType local_1f0;
  HeapType type;
  uint32_t index;
  type_conflict1 *isExplicit;
  type *name;
  string local_1c0;
  string_view local_1a0;
  pair<wasm::Name,_bool> local_190;
  uint32_t local_174;
  undefined1 auStack_170 [4];
  ExternalKind kind;
  Name base;
  undefined1 local_150 [8];
  Name module;
  size_t i;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedTagNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedGlobalNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedMemoryNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedTableNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedFunctionNames;
  Builder builder;
  size_t num;
  WasmBinaryReader *this_local;
  
  uVar4 = getU32LEB(this);
  Builder::Builder((Builder *)&usedFunctionNames._M_h._M_single_bucket,this->wasm);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&usedTableNames._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&usedMemoryNames._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&usedGlobalNames._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&usedTagNames._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&i);
  module.super_IString.str._M_str = (char *)0x0;
  do {
    if ((char *)(ulong)uVar4 <= module.super_IString.str._M_str) {
      sVar18 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::size(&this->wasm->functions);
      this->numFuncImports = (Index)sVar18;
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&i);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&usedTagNames._M_h._M_single_bucket);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&usedGlobalNames._M_h._M_single_bucket);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&usedMemoryNames._M_h._M_single_bucket);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&usedTableNames._M_h._M_single_bucket);
      return;
    }
    NVar19 = getInlineString(this,true);
    module.super_IString.str._M_len = NVar19.super_IString.str._M_str;
    local_150 = NVar19.super_IString.str._M_len;
    NVar19 = getInlineString(this,true);
    base.super_IString.str._M_len = NVar19.super_IString.str._M_str;
    _auStack_170 = NVar19.super_IString.str._M_len;
    local_174 = getU32LEB(this);
    switch(local_174) {
    case 0:
      sVar18 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::size(&this->wasm->functions);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"fimport$",(allocator<char> *)((long)&name + 7));
      sVar14 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::size(&this->wasm->functions);
      sVar20 = (string_view)makeName(&local_1c0,sVar14);
      name_00.super_IString.str._M_str = (char *)&usedTableNames._M_h._M_single_bucket;
      name_00.super_IString.str._M_len = (size_t)sVar20._M_str;
      local_1a0 = sVar20;
      getOrMakeName(&local_190,(wasm *)&this->functionNames,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(sVar18 & 0xffffffff),(Index)sVar20._M_len,name_00,
                    (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)in_stack_fffffffffffff758.id);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name + 7));
      ptVar15 = std::get<0ul,wasm::Name,bool>(&local_190);
      ptVar16 = std::get<1ul,wasm::Name,bool>(&local_190);
      index_00 = getU32LEB(this);
      type = getTypeByIndex(this,index_00);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (&this->functionTypes,&type);
      local_1f0 = getTypeByIndex(this,index_00);
      bVar3 = HeapType::isSignature(&local_1f0);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"Imported function ",&local_2b1);
        IString::toString_abi_cxx11_(&local_2d8,(IString *)local_150);
        std::operator+(&local_290,&local_2b0,&local_2d8);
        std::operator+(&local_270,&local_290,'.');
        IString::toString_abi_cxx11_(&local_2f8,(IString *)auStack_170);
        std::operator+(&local_250,&local_270,&local_2f8);
        std::operator+(&local_230,&local_250,"\'s type must be a signature. Given: ");
        HeapType::toString_abi_cxx11_((string *)&curr,&local_1f0);
        std::operator+(&local_210,&local_230,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curr);
        throwError(this,&local_210);
      }
      local_338 = (char *)(ptVar15->super_IString).str._M_len;
      HStack_330.id = (uintptr_t)(ptVar15->super_IString).str._M_str;
      local_340 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_1f0.id;
      local_358.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_358);
      name_04.super_IString.str._M_str = local_338;
      name_04.super_IString.str._M_len = (size_t)&local_320;
      Builder::makeFunction(name_04,HStack_330,local_340,(Expression *)&local_358);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_358);
      tVar2 = *ptVar16;
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_320);
      (pFVar5->super_Importable).super_Named.hasExplicitName = (bool)(tVar2 & 1);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_320);
      wasm::Name::operator=(&(pFVar5->super_Importable).module,(Name *)local_150);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_320);
      wasm::Name::operator=(&(pFVar5->super_Importable).base,(Name *)auStack_170);
      func = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator*
                       (&local_320);
      sVar18 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::size(&this->wasm->functions);
      setLocalNames(this,func,(Index)sVar18);
      Module::addFunction(this->wasm,&local_320);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_320)
      ;
      break;
    case 1:
      sVar18 = std::
               vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ::size(&this->wasm->tables);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"timport$",(allocator<char> *)((long)&name_1 + 7));
      sVar14 = std::
               vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ::size(&this->wasm->tables);
      sVar20 = (string_view)makeName(&local_3a0,sVar14);
      name_01.super_IString.str._M_str = (char *)&usedMemoryNames._M_h._M_single_bucket;
      name_01.super_IString.str._M_len = (size_t)sVar20._M_str;
      local_380 = sVar20;
      getOrMakeName(&local_370,(wasm *)&this->tableNames,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(sVar18 & 0xffffffff),(Index)sVar20._M_len,name_01,
                    (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)in_stack_fffffffffffff758.id);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name_1 + 7));
      ptVar15 = std::get<0ul,wasm::Name,bool>(&local_370);
      table._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
           std::get<1ul,wasm::Name,bool>(&local_370);
      local_3d8 = (char *)(ptVar15->super_IString).str._M_len;
      TStack_3d0.id = (uintptr_t)(ptVar15->super_IString).str._M_str;
      HeapType::HeapType(&local_3e8,func);
      wasm::Type::Type((Type *)&local_3e0,local_3e8,Nullable,Inexact);
      wasm::Address::Address(&local_3f0,0);
      wasm::Address::Address(&local_3f8,0xffffffff);
      wasm::Type::Type(&local_400,i32);
      name_05.super_IString.str._M_str = local_3d8;
      name_05.super_IString.str._M_len = (size_t)&local_3c0;
      in_stack_fffffffffffff758.id = local_400.id;
      Builder::makeTable(name_05,TStack_3d0,local_3e0,local_3f0,(Type)local_3f8.addr);
      bVar1 = *(byte *)table._M_t.
                       super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      (pTVar6->super_Importable).super_Named.hasExplicitName = (bool)(bVar1 & 1);
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      wasm::Name::operator=(&(pTVar6->super_Importable).module,(Name *)local_150);
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      wasm::Name::operator=(&(pTVar6->super_Importable).base,(Name *)auStack_170);
      TStack_408 = getType(this);
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      (pTVar6->type).id = TStack_408.id;
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      pTVar7 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      pTVar8 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         (&local_3c0);
      wasm::Address::Address(&local_418,0xffffffff);
      getResizableLimits(this,&pTVar6->initial,&pTVar7->max,&local_409,&pTVar8->addressType,
                         local_418);
      if ((local_409 & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"Tables may not be shared",&local_439);
        throwError(this,&local_438);
      }
      Module::addTable(this->wasm,&local_3c0);
      std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_3c0);
      break;
    case 2:
      sVar18 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::size(&this->wasm->memories);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"mimport$",(allocator<char> *)((long)&name_2 + 7));
      sVar14 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::size(&this->wasm->memories);
      sVar20 = (string_view)makeName(&local_488,sVar14);
      name_02.super_IString.str._M_str = (char *)&usedGlobalNames._M_h._M_single_bucket;
      name_02.super_IString.str._M_len = (size_t)sVar20._M_str;
      local_468 = sVar20;
      getOrMakeName(&local_458,(wasm *)&this->memoryNames,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(sVar18 & 0xffffffff),(Index)sVar20._M_len,name_02,
                    (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)in_stack_fffffffffffff758.id);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name_2 + 7));
      ptVar15 = std::get<0ul,wasm::Name,bool>(&local_458);
      memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
           std::get<1ul,wasm::Name,bool>(&local_458);
      local_4b8 = (char *)(ptVar15->super_IString).str._M_len;
      AStack_4b0.addr = (address64_t)(ptVar15->super_IString).str._M_str;
      wasm::Address::Address(&local_4c0,0);
      wasm::Address::Address(&local_4c8,0x10000);
      wasm::Type::Type(&local_4d0,i32);
      name_06.super_IString.str._M_str = local_4b8;
      name_06.super_IString.str._M_len = (size_t)&local_4a8;
      in_stack_fffffffffffff758.id = local_4d0.id;
      Builder::makeMemory(name_06,AStack_4b0,local_4c0,SUB81(local_4c8.addr,0),(Type)0x0);
      bVar1 = *(byte *)memory._M_t.
                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                       super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_4a8);
      (pMVar9->super_Importable).super_Named.hasExplicitName = (bool)(bVar1 & 1);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_4a8);
      wasm::Name::operator=(&(pMVar9->super_Importable).module,(Name *)local_150);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_4a8);
      wasm::Name::operator=(&(pMVar9->super_Importable).base,(Name *)auStack_170);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_4a8);
      pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (&local_4a8);
      pMVar11 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (&local_4a8);
      pMVar12 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (&local_4a8);
      wasm::Address::Address(&local_4d8,0xffffffffffffffff);
      getResizableLimits(this,&pMVar9->initial,&pMVar10->max,&pMVar11->shared,&pMVar12->addressType,
                         local_4d8);
      Module::addMemory(this->wasm,&local_4a8);
      std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_4a8);
      break;
    case 3:
      sVar18 = std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::size(&this->wasm->globals);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,"gimport$",(allocator<char> *)((long)&name_3 + 7));
      sVar14 = std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::size(&this->wasm->globals);
      sVar20 = (string_view)makeName(&local_520,sVar14);
      name_03.super_IString.str._M_str = (char *)&usedTagNames._M_h._M_single_bucket;
      name_03.super_IString.str._M_len = (size_t)sVar20._M_str;
      local_500 = sVar20;
      getOrMakeName(&local_4f0,(wasm *)&this->globalNames,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(sVar18 & 0xffffffff),(Index)sVar20._M_len,name_03,
                    (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)in_stack_fffffffffffff758.id);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name_3 + 7));
      ptVar15 = std::get<0ul,wasm::Name,bool>(&local_4f0);
      type_1.id = (uintptr_t)std::get<1ul,wasm::Name,bool>(&local_4f0);
      TStack_540 = getConcreteType(this);
      local_544 = getU32LEB(this);
      if ((local_544 & 0xfffffffe) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_568,"Global mutability must be 0 or 1",
                   (allocator<char> *)
                   ((long)&curr_1._M_t.
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 7));
        throwError(this,&local_568);
      }
      local_588 = (char *)(ptVar15->super_IString).str._M_len;
      uStack_580 = (uintptr_t)(ptVar15->super_IString).str._M_str;
      local_590 = (Expression *)TStack_540.id;
      name_07.super_IString.str._M_str = local_588;
      name_07.super_IString.str._M_len = (size_t)&local_578;
      Builder::makeGlobal(name_07,(Type)uStack_580,(Expression *)TStack_540.id,Mutable);
      bVar1 = *(byte *)type_1.id;
      pGVar13 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                          (&local_578);
      (pGVar13->super_Importable).super_Named.hasExplicitName = (bool)(bVar1 & 1);
      pGVar13 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                          (&local_578);
      wasm::Name::operator=(&(pGVar13->super_Importable).module,(Name *)local_150);
      pGVar13 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                          (&local_578);
      wasm::Name::operator=(&(pGVar13->super_Importable).base,(Name *)auStack_170);
      Module::addGlobal(this->wasm,&local_578);
      std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_578);
      break;
    case 4:
      sVar18 = std::
               vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
               ::size(&this->wasm->tags);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d8,"eimport$",(allocator<char> *)((long)&name_4 + 7));
      sVar14 = std::
               vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
               ::size(&this->wasm->tags);
      sVar20 = (string_view)makeName(&local_5d8,sVar14);
      NVar19.super_IString.str._M_str = (char *)&i;
      NVar19.super_IString.str._M_len = (size_t)sVar20._M_str;
      local_5b8 = sVar20;
      getOrMakeName(&local_5a8,(wasm *)&this->tagNames,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(sVar18 & 0xffffffff),(Index)sVar20._M_len,NVar19,
                    (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)in_stack_fffffffffffff758.id);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&name_4 + 7));
      ptVar15 = std::get<0ul,wasm::Name,bool>(&local_5a8);
      ptVar16 = std::get<1ul,wasm::Name,bool>(&local_5a8);
      getInt8(this);
      curr_2._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
      super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._4_4_ = getU32LEB(this);
      local_618 = (char *)(ptVar15->super_IString).str._M_len;
      HStack_610.id = (uintptr_t)(ptVar15->super_IString).str._M_str;
      sig = getSignatureByTypeIndex
                      (this,curr_2._M_t.
                            super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._4_4_);
      local_630 = sig;
      HeapType::HeapType(&local_620,sig);
      name_08.super_IString.str._M_str = local_618;
      name_08.super_IString.str._M_len = (size_t)&local_600;
      Builder::makeTag(name_08,HStack_610);
      tVar2 = *ptVar16;
      pTVar17 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_600);
      (pTVar17->super_Importable).super_Named.hasExplicitName = (bool)(tVar2 & 1);
      pTVar17 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_600);
      wasm::Name::operator=(&(pTVar17->super_Importable).module,(Name *)local_150);
      pTVar17 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_600);
      wasm::Name::operator=(&(pTVar17->super_Importable).base,(Name *)auStack_170);
      Module::addTag(this->wasm,&local_600);
      std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_600);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"bad import kind",&local_651);
      throwError(this,&local_650);
    }
    module.super_IString.str._M_str = module.super_IString.str._M_str + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::readImports() {
  size_t num = getU32LEB();
  Builder builder(wasm);
  std::unordered_set<Name> usedFunctionNames, usedTableNames, usedMemoryNames,
    usedGlobalNames, usedTagNames;
  for (size_t i = 0; i < num; i++) {
    auto module = getInlineString();
    auto base = getInlineString();
    auto kind = (ExternalKind)getU32LEB();
    // We set a unique prefix for the name based on the kind. This ensures no
    // collisions between them, which can't occur here (due to the index i) but
    // could occur later due to the names section.
    switch (kind) {
      case ExternalKind::Function: {
        auto [name, isExplicit] =
          getOrMakeName(functionNames,
                        wasm.functions.size(),
                        makeName("fimport$", wasm.functions.size()),
                        usedFunctionNames);
        auto index = getU32LEB();
        functionTypes.push_back(getTypeByIndex(index));
        auto type = getTypeByIndex(index);
        if (!type.isSignature()) {
          throwError(std::string("Imported function ") + module.toString() +
                     '.' + base.toString() +
                     "'s type must be a signature. Given: " + type.toString());
        }
        auto curr = builder.makeFunction(name, type, {});
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        setLocalNames(*curr, wasm.functions.size());
        wasm.addFunction(std::move(curr));
        break;
      }
      case ExternalKind::Table: {
        auto [name, isExplicit] =
          getOrMakeName(tableNames,
                        wasm.tables.size(),
                        makeName("timport$", wasm.tables.size()),
                        usedTableNames);
        auto table = builder.makeTable(name);
        table->hasExplicitName = isExplicit;
        table->module = module;
        table->base = base;
        table->type = getType();

        bool is_shared;
        getResizableLimits(table->initial,
                           table->max,
                           is_shared,
                           table->addressType,
                           Table::kUnlimitedSize);
        if (is_shared) {
          throwError("Tables may not be shared");
        }
        wasm.addTable(std::move(table));
        break;
      }
      case ExternalKind::Memory: {
        auto [name, isExplicit] =
          getOrMakeName(memoryNames,
                        wasm.memories.size(),
                        makeName("mimport$", wasm.memories.size()),
                        usedMemoryNames);
        auto memory = builder.makeMemory(name);
        memory->hasExplicitName = isExplicit;
        memory->module = module;
        memory->base = base;
        getResizableLimits(memory->initial,
                           memory->max,
                           memory->shared,
                           memory->addressType,
                           Memory::kUnlimitedSize);
        wasm.addMemory(std::move(memory));
        break;
      }
      case ExternalKind::Global: {
        auto [name, isExplicit] =
          getOrMakeName(globalNames,
                        wasm.globals.size(),
                        makeName("gimport$", wasm.globals.size()),
                        usedGlobalNames);
        auto type = getConcreteType();
        auto mutable_ = getU32LEB();
        if (mutable_ & ~1) {
          throwError("Global mutability must be 0 or 1");
        }
        auto curr =
          builder.makeGlobal(name,
                             type,
                             nullptr,
                             mutable_ ? Builder::Mutable : Builder::Immutable);
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        wasm.addGlobal(std::move(curr));
        break;
      }
      case ExternalKind::Tag: {
        auto [name, isExplicit] =
          getOrMakeName(tagNames,
                        wasm.tags.size(),
                        makeName("eimport$", wasm.tags.size()),
                        usedTagNames);
        getInt8(); // Reserved 'attribute' field
        auto index = getU32LEB();
        auto curr = builder.makeTag(name, getSignatureByTypeIndex(index));
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        wasm.addTag(std::move(curr));
        break;
      }
      default: {
        throwError("bad import kind");
      }
    }
  }
  numFuncImports = wasm.functions.size();
}